

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O1

int Abc_NtkMfsTryResubOnce(Mfs_Man_t *p,int *pCands,int nCands)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  p->nSatCalls = p->nSatCalls + 1;
  iVar6 = sat_solver_solve(p->pSat,pCands,pCands + nCands,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar6 == -1) {
    iVar6 = 1;
  }
  else {
    if (iVar6 == 1) {
      p->nSatCexes = p->nSatCexes + 1;
      pVVar2 = p->vProjVarsSat;
      lVar7 = 0x6c;
      if (0 < pVVar2->nSize) {
        piVar3 = pVVar2->pArray;
        pVVar4 = p->vDivCexes;
        lVar8 = 0;
        do {
          if (pVVar4->nSize <= lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar1 = piVar3[lVar8];
          if (((int)uVar1 < 0) || (p->pSat->size <= (int)uVar1)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (p->pSat->model[uVar1] != 1) {
            pvVar5 = pVVar4->pArray[lVar8];
            lVar10 = (long)(p->nCexes >> 5);
            uVar1 = *(uint *)((long)pvVar5 + lVar10 * 4);
            uVar9 = p->nCexes & 0x1f;
            if ((uVar1 >> uVar9 & 1) == 0) {
              __assert_fail("Abc_InfoHasBit(pData, p->nCexes)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                            ,0x91,"int Abc_NtkMfsTryResubOnce(Mfs_Man_t *, int *, int)");
            }
            *(uint *)((long)pvVar5 + lVar10 * 4) = uVar1 ^ 1 << uVar9;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar2->nSize);
      }
      iVar6 = 0;
    }
    else {
      iVar6 = -1;
      lVar7 = 0x314;
    }
    piVar3 = (int *)((long)&p->pPars + lVar7);
    *piVar3 = *piVar3 + 1;
  }
  return iVar6;
}

Assistant:

int Abc_NtkMfsTryResubOnce( Mfs_Man_t * p, int * pCands, int nCands )
{
    int fVeryVerbose = 0;
    unsigned * pData;
    int RetValue, RetValue2 = -1, iVar, i;//, clk = Abc_Clock();
/*
    if ( p->pPars->fGiaSat )
    {
        RetValue2 = Abc_NtkMfsTryResubOnceGia( p, pCands, nCands );
p->timeGia += Abc_Clock() - clk;
        return RetValue2;
    }
*/ 
    p->nSatCalls++;
    RetValue = sat_solver_solve( p->pSat, pCands, pCands + nCands, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//    assert( RetValue == l_False || RetValue == l_True );

    if ( RetValue != l_Undef && RetValue2 != -1 )
    {
        assert( (RetValue == l_False) == (RetValue2 == 1) );
    }

    if ( RetValue == l_False )
    {
        if ( fVeryVerbose )
        printf( "U " );
        return 1;
    }
    if ( RetValue != l_True )
    {
        if ( fVeryVerbose )
        printf( "T " );
        p->nTimeOuts++;
        return -1;
    }
    if ( fVeryVerbose )
    printf( "S " );
    p->nSatCexes++;
    // store the counter-example
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, i )
    {
        pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
        if ( !sat_solver_var_value( p->pSat, iVar ) ) // remove 0s!!!
        {
            assert( Abc_InfoHasBit(pData, p->nCexes) );
            Abc_InfoXorBit( pData, p->nCexes );
        }
    }
    p->nCexes++;
    return 0;

}